

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O3

void __thiscall
Eigen::TriangularView<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,9u>::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
          (TriangularView<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,9u> *this,
          MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
          *other)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar7 = _DAT_00111120;
  auVar6 = _DAT_00111110;
  uVar3 = *(ulong *)(this + 8);
  if ((uVar3 == *(ulong *)other) &&
     (uVar4 = *(ulong *)(this + 0x10), uVar4 == *(ulong *)(other + 8))) {
    if (0 < (long)uVar4) {
      lVar5 = *(long *)(this + 0x20);
      lVar8 = *(long *)this + 0x10;
      uVar9 = uVar3;
      uVar11 = 0;
      do {
        uVar1 = uVar11 + 1;
        if ((long)uVar1 < (long)uVar3) {
          uVar2 = *(undefined8 *)(other + 0x10);
          lVar10 = ~uVar11 + uVar3 + -1;
          auVar12._8_4_ = (int)lVar10;
          auVar12._0_8_ = lVar10;
          auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar12 = auVar12 ^ auVar7;
          uVar11 = 0;
          do {
            auVar13._8_4_ = (int)uVar11;
            auVar13._0_8_ = uVar11;
            auVar13._12_4_ = (int)(uVar11 >> 0x20);
            auVar13 = (auVar13 | auVar6) ^ auVar7;
            if ((bool)(~(auVar12._4_4_ < auVar13._4_4_ ||
                        auVar12._0_4_ < auVar13._0_4_ && auVar13._4_4_ == auVar12._4_4_) & 1)) {
              *(undefined8 *)(lVar8 + -8 + uVar11 * 8) = uVar2;
            }
            if (auVar13._12_4_ <= auVar12._12_4_ &&
                (auVar13._8_4_ <= auVar12._8_4_ || auVar13._12_4_ != auVar12._12_4_)) {
              *(undefined8 *)(lVar8 + uVar11 * 8) = uVar2;
            }
            uVar11 = uVar11 + 2;
          } while ((uVar9 & 0xfffffffffffffffe) != uVar11);
        }
        uVar9 = uVar9 - 1;
        lVar8 = lVar8 + lVar5 * 8 + 8;
        uVar11 = uVar1;
      } while (uVar1 != uVar4);
    }
    return;
  }
  __assert_fail("m_matrix.rows() == other.rows() && m_matrix.cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/TriangularMatrix.h"
                ,0x272,
                "void Eigen::TriangularView<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 9>::lazyAssign(const MatrixBase<OtherDerived> &) [MatrixType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Mode = 9, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Block<Eigen::Matrix<double, -1, -1>>>]"
               );
}

Assistant:

inline Scalar operator()(Index row, Index col) const
    {
      check_coordinates(row, col);
      return coeff(row,col);
    }